

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollisionObject.cpp
# Opt level: O0

collision_object_ptr __thiscall
APhyBullet::BulletCollisionObject::getOverlappingObject(BulletCollisionObject *this,aphy_size index)

{
  bool bVar1;
  btCollisionObject *this_00;
  base_interface *this_01;
  btGhostObject *in_RDI;
  BulletCollisionObject *objectWrapper;
  btCollisionObject *object;
  int in_stack_ffffffffffffffcc;
  Counter *local_8;
  
  bVar1 = isGhostObjectType((APhyCollisionObjectType)
                            (in_RDI->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].
                            m_floats[0]);
  if (bVar1) {
    this_00 = btGhostObject::getOverlappingObject(in_RDI,in_stack_ffffffffffffffcc);
    if (this_00 == (btCollisionObject *)0x0) {
      local_8 = (Counter *)0x0;
    }
    else {
      this_01 = (base_interface *)btCollisionObject::getUserPointer(this_00);
      if (this_01 == (base_interface *)0x0) {
        local_8 = (Counter *)0x0;
      }
      else {
        aphy::base_interface::refFromThis<aphy::collision_object>(this_01);
        local_8 = aphy::ref<aphy::collision_object>::disownedNewRef
                            ((ref<aphy::collision_object> *)in_RDI);
      }
    }
  }
  else {
    local_8 = (Counter *)0x0;
  }
  return local_8;
}

Assistant:

collision_object_ptr BulletCollisionObject::getOverlappingObject(aphy_size index)
{
    if(!isGhostObjectType(type))
        return nullptr;

    auto object = static_cast<btGhostObject*> (handle)->getOverlappingObject(index);
    if(!object)
        return nullptr;

    auto objectWrapper = reinterpret_cast<BulletCollisionObject*> (object->getUserPointer());
    if(!objectWrapper)
        return nullptr;

    return objectWrapper->refFromThis<aphy::collision_object> ().disownedNewRef();
}